

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Parser.cpp
# Opt level: O1

unique_ptr<enact::Stmt,_std::default_delete<enact::Stmt>_> __thiscall
enact::Parser::parseStmt(Parser *this)

{
  Parser *in_RSI;
  
  if ((in_RSI->m_current).type == FUNC) {
    advance(in_RSI);
    parseFunctionStmt(this,SUB81(in_RSI,0));
  }
  else if ((in_RSI->m_current).type == STRUCT) {
    advance(in_RSI);
    parseStructStmt(this);
  }
  else if ((in_RSI->m_current).type == ENUM) {
    advance(in_RSI);
    parseEnumStmt(this);
  }
  else if ((in_RSI->m_current).type == TRAIT) {
    advance(in_RSI);
    parseTraitStmt(this);
  }
  else if ((in_RSI->m_current).type == IMPL) {
    advance(in_RSI);
    parseImplStmt(this);
  }
  else {
    if ((in_RSI->m_current).type == IMM) {
      advance(in_RSI);
    }
    else {
      if ((in_RSI->m_current).type != MUT) {
        if ((in_RSI->m_current).type == RETURN) {
          advance(in_RSI);
          parseReturnStmt(this);
          return (__uniq_ptr_data<enact::Stmt,_std::default_delete<enact::Stmt>,_true,_true>)
                 (__uniq_ptr_data<enact::Stmt,_std::default_delete<enact::Stmt>,_true,_true>)this;
        }
        if ((in_RSI->m_current).type != BREAK) {
          if ((in_RSI->m_current).type != CONTINUE) {
            parseExpressionStmt(this);
            return (__uniq_ptr_data<enact::Stmt,_std::default_delete<enact::Stmt>,_true,_true>)
                   (__uniq_ptr_data<enact::Stmt,_std::default_delete<enact::Stmt>,_true,_true>)this;
          }
          advance(in_RSI);
          parseContinueStmt(this);
          return (__uniq_ptr_data<enact::Stmt,_std::default_delete<enact::Stmt>,_true,_true>)
                 (__uniq_ptr_data<enact::Stmt,_std::default_delete<enact::Stmt>,_true,_true>)this;
        }
        advance(in_RSI);
        parseBreakStmt(this);
        return (__uniq_ptr_data<enact::Stmt,_std::default_delete<enact::Stmt>,_true,_true>)
               (__uniq_ptr_data<enact::Stmt,_std::default_delete<enact::Stmt>,_true,_true>)this;
      }
      advance(in_RSI);
    }
    parseVariableStmt(this);
  }
  return (__uniq_ptr_data<enact::Stmt,_std::default_delete<enact::Stmt>,_true,_true>)
         (__uniq_ptr_data<enact::Stmt,_std::default_delete<enact::Stmt>,_true,_true>)this;
}

Assistant:

std::unique_ptr<Stmt> Parser::parseStmt() {
        try {
            if (consume(TokenType::FUNC))     return parseFunctionStmt();
            if (consume(TokenType::STRUCT))   return parseStructStmt();
            if (consume(TokenType::ENUM))     return parseEnumStmt();
            if (consume(TokenType::TRAIT))    return parseTraitStmt();
            if (consume(TokenType::IMPL))     return parseImplStmt();
            if (consume(TokenType::IMM) ||
                consume(TokenType::MUT))      return parseVariableStmt();
            if (consume(TokenType::RETURN))   return parseReturnStmt();
            if (consume(TokenType::BREAK))    return parseBreakStmt();
            if (consume(TokenType::CONTINUE)) return parseContinueStmt();
            return parseExpressionStmt();
        } catch (ParseError &error) {
            synchronise();
            return nullptr;
        }
    }